

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_sei.cpp
# Opt level: O0

void write_sei_payload(h264_stream_t *h,bs_t *b,int payloadType,int payloadSize)

{
  sei_t *psVar1;
  int local_2c;
  int i;
  sei_t *s;
  int payloadSize_local;
  int payloadType_local;
  bs_t *b_local;
  h264_stream_t *h_local;
  
  psVar1 = h->sei;
  for (local_2c = 0; local_2c < psVar1->payloadSize; local_2c = local_2c + 1) {
    bs_write_u(b,8,(uint)psVar1->payload[local_2c]);
  }
  return;
}

Assistant:

void write_sei_payload(h264_stream_t* h, bs_t* b, int payloadType, int payloadSize)
{
    sei_t* s = h->sei;

    int i;
    for ( i = 0; i < s->payloadSize; i++ )
        bs_write_u(b, 8, s->payload[i]);
}